

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialassetid.cpp
# Opt level: O1

void __thiscall
ConfidentialAssetId_Constractor_bytedata32_Test::~ConfidentialAssetId_Constractor_bytedata32_Test
          (ConfidentialAssetId_Constractor_bytedata32_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialAssetId, Constractor_bytedata32) {
  // 32byte
  ByteData bytedata(
      "0a7f0c8d0a4e6fb92c63893345facbd99dc603dc1cd18c73e5700bd9a0babb1f");
  ConfidentialAssetId assetid(bytedata);
  EXPECT_STREQ(
      assetid.GetHex().c_str(),
      "1fbbbaa0d90b70e5738cd11cdc03c69dd9cbfa453389632cb96f4e0a8d0c7f0a");
  EXPECT_EQ(assetid.GetData().GetDataSize(), 33);
  EXPECT_EQ(assetid.HasBlinding(), false);
  EXPECT_STREQ(
      assetid.GetUnblindedData().GetHex().c_str(),
      "0a7f0c8d0a4e6fb92c63893345facbd99dc603dc1cd18c73e5700bd9a0babb1f");
}